

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageFuel.cpp
# Opt level: O0

bool __thiscall DIS::StorageFuel::operator==(StorageFuel *this,StorageFuel *rhs)

{
  bool local_19;
  bool ivarsEqual;
  StorageFuel *rhs_local;
  StorageFuel *this_local;
  
  local_19 = this->_fuelMeasurementUnits == rhs->_fuelMeasurementUnits &&
             this->_fuelQuantity == rhs->_fuelQuantity;
  if (this->_fuelType != rhs->_fuelType) {
    local_19 = false;
  }
  if (this->_fuelLocation != rhs->_fuelLocation) {
    local_19 = false;
  }
  if (this->_padding != rhs->_padding) {
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool StorageFuel::operator ==(const StorageFuel& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_fuelQuantity == rhs._fuelQuantity) ) ivarsEqual = false;
     if( ! (_fuelMeasurementUnits == rhs._fuelMeasurementUnits) ) ivarsEqual = false;
     if( ! (_fuelType == rhs._fuelType) ) ivarsEqual = false;
     if( ! (_fuelLocation == rhs._fuelLocation) ) ivarsEqual = false;
     if( ! (_padding == rhs._padding) ) ivarsEqual = false;

    return ivarsEqual;
 }